

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTagToArray
          (UnknownField *this,uint8 *target)

{
  string *str;
  uint32 value;
  LogMessage *other;
  uint8 *puVar1;
  string *data;
  byte local_51;
  LogMessage local_50;
  uint8 *local_18;
  uint8 *target_local;
  UnknownField *this_local;
  
  local_51 = 0;
  local_18 = target;
  target_local = (uint8 *)this;
  if (*(uint *)this >> 0x1d != 3) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x102);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type_): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&data + 3),other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  str = (string *)(this->field_2).group_;
  value = std::__cxx11::string::size();
  local_18 = io::CodedOutputStream::WriteVarint32ToArray(value,local_18);
  puVar1 = io::CodedOutputStream::WriteStringToArray(str,local_18);
  return puVar1;
}

Assistant:

uint8* UnknownField::SerializeLengthDelimitedNoTagToArray(uint8* target) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type_);
  const string& data = *length_delimited_.string_value_;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = io::CodedOutputStream::WriteStringToArray(data, target);
  return target;
}